

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# univalue.cpp
# Opt level: O3

bool __thiscall
UniValue::checkObject
          (UniValue *this,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue::VType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue::VType>_>_>
          *t)

{
  pointer pUVar1;
  bool bVar2;
  _Rb_tree_node_base *p_Var3;
  ulong uVar4;
  size_t idx;
  size_t local_38;
  
  if (this->typ == VOBJ) {
    p_Var3 = *(_Rb_tree_node_base **)(t + 0x18);
    if (p_Var3 == (_Rb_tree_node_base *)(t + 8)) {
      bVar2 = true;
    }
    else {
      pUVar1 = (this->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar4 = ((long)(this->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)pUVar1 >> 3) * 0x2e8ba2e8ba2e8ba3;
      do {
        local_38 = 0;
        bVar2 = findKey(this,(string *)(p_Var3 + 1),&local_38);
        if (!bVar2) goto LAB_0010604f;
        if (uVar4 < local_38 || uVar4 - local_38 == 0) {
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     local_38,uVar4);
        }
        bVar2 = pUVar1[local_38].typ == p_Var3[2]._M_color;
      } while ((bVar2) &&
              (p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3),
              p_Var3 != (_Rb_tree_node_base *)(t + 8)));
    }
  }
  else {
LAB_0010604f:
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool UniValue::checkObject(const std::map<std::string,UniValue::VType>& t) const
{
    if (typ != VOBJ)
        return false;

    for (std::map<std::string,UniValue::VType>::const_iterator it = t.begin();
         it != t.end(); ++it) {
        size_t idx = 0;
        if (!findKey(it->first, idx))
            return false;

        if (values.at(idx).getType() != it->second)
            return false;
    }

    return true;
}